

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O3

PropReqs *
yactfr::internal::JsonDtValReq::_buildPropReqs
          (PropReqs *__return_storage_ptr__,string *type,PropReqs *propReqs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __hashtable *__h;
  PropReqsEntry local_58;
  
  anon_unknown_0::objTypePropReqEntry(&local_58,type);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)propReqs,&local_58);
  if (local_58.second._valReq.
      super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.second._valReq.
               super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  paVar1 = &local_58.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  (anonymous_namespace)::attrsPropReqEntry_abi_cxx11_();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)propReqs,&local_58);
  if (local_58.second._valReq.
      super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.second._valReq.
               super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  (anonymous_namespace)::extPropReqEntry_abi_cxx11_();
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)propReqs,&local_58);
  if (local_58.second._valReq.
      super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.second._valReq.
               super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,propReqs,propReqs);
  return __return_storage_ptr__;
}

Assistant:

static PropReqs _buildPropReqs(std::string&& type, PropReqs&& propReqs)
    {
        propReqs.insert(objTypePropReqEntry(std::move(type)));
        propReqs.insert(attrsPropReqEntry());
        propReqs.insert(extPropReqEntry());
        return std::move(propReqs);
    }